

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_itrans_recon_8x8.c
# Opt level: O1

void ihevc_chroma_itrans_recon_8x8
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 in_XMM0 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int local_b8 [14];
  WORD32 e [4];
  WORD32 o [4];
  
  uVar7 = zero_cols & 0xf0;
  iVar11 = (uint)(uVar7 != 0xf0) * 4 + 4;
  auVar14 = pmovsxwd(in_XMM0,0x120032004b0059);
  auVar15 = pmovsxwd(in_XMM1,0xffceffa7ffee004b);
  auVar16 = pmovsxwd(in_XMM2,0x4b0012ffa70032);
  auVar17 = pmovsxwd(in_XMM3,0xffa7004bffce0012);
  auVar18 = pmovsxbd(in_XMM4,0x40404040);
  lVar8 = 0;
  do {
    if ((zero_cols & 1U) == 0) {
      iVar9 = (int)*(short *)((long)pi2_src + lVar8 + (long)(src_strd * 7) * 2);
      iVar5 = (int)*(short *)((long)pi2_src + lVar8 + (long)(src_strd * 5) * 2);
      iVar1 = (int)*(short *)((long)pi2_src + lVar8 + (long)(src_strd * 3) * 2);
      iVar2 = (int)*(short *)((long)pi2_src + lVar8 + (long)src_strd * 2);
      iVar6 = (int)*(short *)((long)pi2_src + lVar8 + (long)(src_strd * 2) * 2);
      iVar10 = (int)*(short *)((long)pi2_src + lVar8 + (long)(src_strd * 6) * 2);
      iVar3 = iVar10 * 0x24 + iVar6 * 0x53;
      iVar10 = iVar10 * -0x53 + iVar6 * 0x24;
      iVar6 = (int)*(short *)((long)pi2_src + lVar8 + (long)(src_strd * 4) * 2);
      iVar12 = iVar6 * 0x40 + *(short *)((long)pi2_src + lVar8) * 0x40;
      iVar13 = iVar6 * -0x40 + *(short *)((long)pi2_src + lVar8) * 0x40;
      iVar6 = iVar12 + iVar3;
      iVar12 = iVar12 - iVar3;
      iVar3 = iVar13 + iVar10;
      iVar13 = iVar13 - iVar10;
      auVar26._4_4_ = iVar2;
      auVar26._0_4_ = iVar2;
      auVar26._8_4_ = iVar2;
      auVar26._12_4_ = iVar2;
      auVar22._4_4_ = iVar1;
      auVar22._0_4_ = iVar1;
      auVar22._8_4_ = iVar1;
      auVar22._12_4_ = iVar1;
      auVar24._4_4_ = iVar5;
      auVar24._0_4_ = iVar5;
      auVar24._8_4_ = iVar5;
      auVar24._12_4_ = iVar5;
      auVar20._4_4_ = iVar9;
      auVar20._0_4_ = iVar9;
      auVar20._8_4_ = iVar9;
      auVar20._12_4_ = iVar9;
      auVar27 = pmulld(auVar26,auVar14);
      auVar22 = pmulld(auVar22,auVar15);
      auVar25 = pmulld(auVar24,auVar16);
      auVar20 = pmulld(auVar20,auVar17);
      iVar1 = auVar20._0_4_ + auVar25._0_4_ + auVar22._0_4_ + auVar27._0_4_;
      iVar2 = auVar20._4_4_ + auVar25._4_4_ + auVar22._4_4_ + auVar27._4_4_;
      iVar5 = auVar20._8_4_ + auVar25._8_4_ + auVar22._8_4_ + auVar27._8_4_;
      iVar9 = auVar20._12_4_ + auVar25._12_4_ + auVar22._12_4_ + auVar27._12_4_;
      auVar25._0_4_ = iVar6 + iVar1 + auVar18._0_4_ >> 7;
      auVar25._4_4_ = iVar3 + iVar2 + auVar18._4_4_ >> 7;
      auVar25._8_4_ = iVar13 + iVar5 + auVar18._8_4_ >> 7;
      auVar25._12_4_ = iVar12 + iVar9 + auVar18._12_4_ >> 7;
      auVar20 = packssdw(auVar25,auVar25);
      *(long *)(pi2_tmp + lVar8 * 4) = auVar20._0_8_;
      auVar27._0_4_ = (iVar12 - iVar9) + auVar18._0_4_ >> 7;
      auVar27._4_4_ = (iVar13 - iVar5) + auVar18._4_4_ >> 7;
      auVar27._8_4_ = (iVar3 - iVar2) + auVar18._8_4_ >> 7;
      auVar27._12_4_ = (iVar6 - iVar1) + auVar18._12_4_ >> 7;
      auVar20 = packssdw(auVar27,auVar27);
      *(long *)(pi2_tmp + lVar8 * 4 + 4) = auVar20._0_8_;
    }
    else {
      *(undefined1 (*) [16])(pi2_tmp + lVar8 * 4) = (undefined1  [16])0x0;
    }
    zero_cols = zero_cols >> 1;
    lVar8 = lVar8 + 2;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  if (uVar7 == 0xf0) {
    iVar11 = 0;
    do {
      iVar6 = (int)pi2_tmp[0x18];
      iVar3 = (int)pi2_tmp[8];
      auVar16._4_4_ = iVar3;
      auVar16._0_4_ = iVar3;
      auVar16._8_4_ = iVar3;
      auVar16._12_4_ = iVar3;
      auVar17._4_4_ = iVar6;
      auVar17._0_4_ = iVar6;
      auVar17._8_4_ = iVar6;
      auVar17._12_4_ = iVar6;
      auVar16 = pmulld(auVar16,auVar14);
      auVar17 = pmulld(auVar17,auVar15);
      e[2] = auVar17._0_4_ + auVar16._0_4_;
      e[3] = auVar17._4_4_ + auVar16._4_4_;
      iVar6 = (int)pi2_tmp[0x10];
      iVar1 = *pi2_tmp * 0x40;
      iVar3 = *pi2_tmp * 0x40;
      local_b8[0] = iVar3 + iVar6 * 0x53;
      local_b8[3] = iVar3 + iVar6 * -0x53;
      local_b8[1] = iVar1 + iVar6 * 0x24;
      local_b8[2] = iVar1 + iVar6 * -0x24;
      lVar8 = 6;
      lVar4 = 0;
      do {
        iVar6 = *(int *)((long)local_b8 + lVar4 * 2) + *(int *)((long)e + lVar4 * 2 + 8) + 0x800 >>
                0xc;
        if (iVar6 < -0x7fff) {
          iVar6 = -0x8000;
        }
        if (0x7ffe < iVar6) {
          iVar6 = 0x7fff;
        }
        iVar6 = (uint)pu1_pred[lVar4] + iVar6;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        pu1_dst[lVar4] = (UWORD8)iVar6;
        iVar6 = (*(int *)((long)local_b8 + lVar8 * 2) - *(int *)((long)e + lVar8 * 2 + 8)) + 0x800
                >> 0xc;
        if (iVar6 < -0x7fff) {
          iVar6 = -0x8000;
        }
        if (0x7ffe < iVar6) {
          iVar6 = 0x7fff;
        }
        iVar6 = (uint)pu1_pred[lVar4 + 8] + iVar6;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        pu1_dst[lVar4 + 8] = (UWORD8)iVar6;
        lVar8 = lVar8 + -2;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 8);
      pi2_tmp = pi2_tmp + 1;
      pu1_pred = pu1_pred + pred_strd;
      pu1_dst = pu1_dst + dst_strd;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 8);
  }
  else {
    iVar11 = 0;
    do {
      iVar6 = (int)pi2_tmp[0x38];
      iVar3 = (int)pi2_tmp[0x28];
      iVar1 = (int)pi2_tmp[0x18];
      iVar2 = (int)pi2_tmp[8];
      auVar18._4_4_ = iVar2;
      auVar18._0_4_ = iVar2;
      auVar18._8_4_ = iVar2;
      auVar18._12_4_ = iVar2;
      auVar19._4_4_ = iVar1;
      auVar19._0_4_ = iVar1;
      auVar19._8_4_ = iVar1;
      auVar19._12_4_ = iVar1;
      auVar21._4_4_ = iVar3;
      auVar21._0_4_ = iVar3;
      auVar21._8_4_ = iVar3;
      auVar21._12_4_ = iVar3;
      auVar23._4_4_ = iVar6;
      auVar23._0_4_ = iVar6;
      auVar23._8_4_ = iVar6;
      auVar23._12_4_ = iVar6;
      auVar18 = pmulld(auVar18,auVar14);
      auVar20 = pmulld(auVar19,auVar15);
      auVar22 = pmulld(auVar21,auVar16);
      auVar25 = pmulld(auVar23,auVar17);
      e[2] = auVar25._0_4_ + auVar22._0_4_ + auVar20._0_4_ + auVar18._0_4_;
      e[3] = auVar25._4_4_ + auVar22._4_4_ + auVar20._4_4_ + auVar18._4_4_;
      iVar1 = pi2_tmp[0x30] * 0x24 + pi2_tmp[0x10] * 0x53;
      iVar6 = pi2_tmp[0x30] * -0x53 + pi2_tmp[0x10] * 0x24;
      iVar2 = pi2_tmp[0x20] * 0x40 + *pi2_tmp * 0x40;
      iVar3 = pi2_tmp[0x20] * -0x40 + *pi2_tmp * 0x40;
      local_b8[0] = iVar2 + iVar1;
      local_b8[3] = iVar2 - iVar1;
      local_b8[1] = iVar3 + iVar6;
      local_b8[2] = iVar3 - iVar6;
      lVar8 = 6;
      lVar4 = 0;
      do {
        iVar6 = *(int *)((long)local_b8 + lVar4 * 2) + *(int *)((long)e + lVar4 * 2 + 8) + 0x800 >>
                0xc;
        if (iVar6 < -0x7fff) {
          iVar6 = -0x8000;
        }
        if (0x7ffe < iVar6) {
          iVar6 = 0x7fff;
        }
        iVar6 = (uint)pu1_pred[lVar4] + iVar6;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        pu1_dst[lVar4] = (UWORD8)iVar6;
        iVar6 = (*(int *)((long)local_b8 + lVar8 * 2) - *(int *)((long)e + lVar8 * 2 + 8)) + 0x800
                >> 0xc;
        if (iVar6 < -0x7fff) {
          iVar6 = -0x8000;
        }
        if (0x7ffe < iVar6) {
          iVar6 = 0x7fff;
        }
        iVar6 = (uint)pu1_pred[lVar4 + 8] + iVar6;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        pu1_dst[lVar4 + 8] = (UWORD8)iVar6;
        lVar8 = lVar8 + -2;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 8);
      pi2_tmp = pi2_tmp + 1;
      pu1_pred = pu1_pred + pred_strd;
      pu1_dst = pu1_dst + dst_strd;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 8);
  }
  return;
}

Assistant:

void ihevc_chroma_itrans_recon_8x8(WORD16 *pi2_src,
                                   WORD16 *pi2_tmp,
                                   UWORD8 *pu1_pred,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd,
                                   WORD32 pred_strd,
                                   WORD32 dst_strd,
                                   WORD32 zero_cols,
                                   WORD32 zero_rows)
{
    WORD32 j, k;
    WORD32 e[4], o[4];
    WORD32 ee[2], eo[2];
    WORD32 add;
    WORD32 shift;
    WORD16 *pi2_tmp_orig;
    WORD32 trans_size;
    WORD32 zero_rows_2nd_stage = zero_cols;
    WORD32 row_limit_2nd_stage;
    UNUSED(zero_rows);
    trans_size = TRANS_SIZE_8;

    pi2_tmp_orig = pi2_tmp;

    if((zero_cols & 0xF0) == 0xF0)
        row_limit_2nd_stage = 4;
    else
        row_limit_2nd_stage = TRANS_SIZE_8;

    /* Inverse Transform 1st stage */
    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    {
        /************************************************************************************************/
        /**********************************START - IT_RECON_8x8******************************************/
        /************************************************************************************************/

        for(j = 0; j < row_limit_2nd_stage; j++)
        {
            /* Checking for Zero Cols */
            if((zero_cols & 1) == 1)
            {
                memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
            }
            else
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_src[3 * src_strd]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_src[5 * src_strd]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_src[7 * src_strd];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_src[6 * src_strd];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_src[6 * src_strd];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_src[4 * src_strd];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_src[4 * src_strd];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    pi2_tmp[k] =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pi2_tmp[k + 4] =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                }
            }
            pi2_src++;
            pi2_tmp += trans_size;
            zero_cols = zero_cols >> 1;
        }

        pi2_tmp = pi2_tmp_orig;

        /* Inverse Transform 2nd stage */
        shift = IT_SHIFT_STAGE_2;
        add = 1 << (shift - 1);

        if((zero_rows_2nd_stage & 0xF0) == 0xF0) /* First 4 rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size];
                }
                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k * 2] = CLIP_U8((itrans_out + pu1_pred[k * 2]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[(k + 4) * 2] =
                                    CLIP_U8((itrans_out + pu1_pred[(k + 4) * 2]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        else /* All rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_tmp[5 * trans_size]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_tmp[7 * trans_size];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_tmp[6 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_tmp[6 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_tmp[4 * trans_size];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_tmp[4 * trans_size];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k * 2] = CLIP_U8((itrans_out + pu1_pred[k * 2]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[(k + 4) * 2] =
                                    CLIP_U8((itrans_out + pu1_pred[(k + 4) * 2]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        /************************************************************************************************/
        /************************************END - IT_RECON_8x8******************************************/
        /************************************************************************************************/
    }
}